

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_buffered_region.cc
# Opt level: O0

S2LatLngRect * __thiscall
S2ShapeIndexBufferedRegion::GetRectBound
          (S2LatLngRect *__return_storage_ptr__,S2ShapeIndexBufferedRegion *this)

{
  S2ShapeIndex *index;
  int in_EDX;
  S1Angle distance;
  S2ShapeIndexRegion<S2ShapeIndex> local_68;
  undefined1 local_40 [8];
  S2LatLngRect orig_rect;
  S2ShapeIndexBufferedRegion *this_local;
  
  orig_rect.lng_.bounds_.c_[1] = (VType)this;
  index = (S2ShapeIndex *)S2ShapeIndexBufferedRegion::index(this,(char *)this,in_EDX);
  MakeS2ShapeIndexRegion<S2ShapeIndex>(&local_68,index);
  S2ShapeIndexRegion<S2ShapeIndex>::GetRectBound((S2LatLngRect *)local_40,&local_68);
  S2ShapeIndexRegion<S2ShapeIndex>::~S2ShapeIndexRegion(&local_68);
  distance = S1ChordAngle::ToAngle(&this->radius_);
  S2LatLngRect::ExpandedByDistance(__return_storage_ptr__,(S2LatLngRect *)local_40,distance);
  S2LatLngRect::~S2LatLngRect((S2LatLngRect *)local_40);
  return __return_storage_ptr__;
}

Assistant:

S2LatLngRect S2ShapeIndexBufferedRegion::GetRectBound() const {
  S2LatLngRect orig_rect = MakeS2ShapeIndexRegion(&index()).GetRectBound();
  return orig_rect.ExpandedByDistance(radius_.ToAngle());
}